

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic.c
# Opt level: O0

int main(void)

{
  int iVar1;
  SUNContext ctx;
  long netf;
  long ncfn;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  sunrealtype tout;
  sunrealtype t;
  FILE *UFID;
  void *arkode_mem;
  SUNLinearSolver LS;
  SUNMatrix A;
  N_Vector y;
  int flag;
  sunrealtype lamda;
  sunrealtype abstol;
  sunrealtype reltol;
  sunindextype NEQ;
  sunrealtype dTout;
  sunrealtype Tf;
  sunrealtype T0;
  int in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  void *in_stack_ffffffffffffff28;
  undefined8 local_d0;
  sunrealtype in_stack_ffffffffffffff38;
  sunrealtype in_stack_ffffffffffffff40;
  sunrealtype in_stack_ffffffffffffff48;
  N_Vector in_stack_ffffffffffffff50;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  char *local_80;
  double local_78;
  FILE *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  long *local_50;
  int local_44;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  double local_20;
  char *local_18;
  double local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = 0.0;
  local_18 = (char *)0x4024000000000000;
  local_20 = 1.0;
  local_28 = 1;
  local_30 = 0x3eb0c6f7a0b5ed8d;
  local_38 = 0x3ddb7cdfd9d7bdbb;
  local_40 = 0xc059000000000000;
  local_50 = (long *)0x0;
  local_58 = 0;
  local_60 = 0;
  local_68 = 0;
  local_44 = SUNContext_Create(0,&stack0xffffffffffffff28);
  iVar1 = check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  if (iVar1 == 0) {
    printf("\nAnalytical ODE test problem:\n");
    printf("    lamda = %g\n",local_40);
    printf("   reltol = %.1e\n",local_30);
    printf("   abstol = %.1e\n\n",local_38);
    local_50 = (long *)N_VNew_Serial(local_28,in_stack_ffffffffffffff28);
    iVar1 = check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c
                      );
    if (iVar1 == 0) {
      N_VConst(0,local_50);
      local_68 = ARKStepCreate(local_10,0,f,local_50,in_stack_ffffffffffffff28);
      iVar1 = check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                         in_stack_ffffffffffffff1c);
      if (iVar1 == 0) {
        local_44 = ARKodeSetUserData(local_68,&local_40);
        iVar1 = check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                           in_stack_ffffffffffffff1c);
        if (iVar1 == 0) {
          local_44 = ARKodeSStolerances(local_30,local_38,local_68);
          iVar1 = check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                             in_stack_ffffffffffffff1c);
          if (iVar1 == 0) {
            local_58 = SUNDenseMatrix(local_28,local_28,in_stack_ffffffffffffff28);
            iVar1 = check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                               in_stack_ffffffffffffff1c);
            if (iVar1 == 0) {
              local_60 = SUNLinSol_Dense(local_50,local_58,in_stack_ffffffffffffff28);
              iVar1 = check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                 in_stack_ffffffffffffff1c);
              if (iVar1 == 0) {
                local_44 = ARKodeSetLinearSolver(local_68,local_60,local_58);
                iVar1 = check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                   in_stack_ffffffffffffff1c);
                if (iVar1 == 0) {
                  local_44 = ARKodeSetJacFn(local_68,Jac);
                  iVar1 = check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                     in_stack_ffffffffffffff1c);
                  if (iVar1 == 0) {
                    local_44 = ARKodeSetLinear(local_68,0);
                    iVar1 = check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                       in_stack_ffffffffffffff1c);
                    if (iVar1 == 0) {
                      local_70 = fopen("solution.txt","w");
                      fprintf(local_70,"# t u\n");
                      fprintf(local_70," %.16e %.16e\n",local_10,**(undefined8 **)(*local_50 + 0x10)
                             );
                      local_78 = local_10;
                      local_80 = (char *)(local_10 + local_20);
                      printf("        t           u\n");
                      printf("   ---------------------\n");
                      while (1e-15 < (double)local_18 - local_78) {
                        local_44 = ARKodeEvolve(local_80,local_68,local_50,&local_78,1);
                        iVar1 = check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                           in_stack_ffffffffffffff1c);
                        if (iVar1 != 0) break;
                        printf("  %10.6f  %10.6f\n",local_78,**(undefined8 **)(*local_50 + 0x10));
                        fprintf(local_70," %.16e %.16e\n",local_78,
                                **(undefined8 **)(*local_50 + 0x10));
                        if (local_44 < 0) {
                          fprintf(_stderr,"Solver failure, stopping integration\n");
                          break;
                        }
                        in_stack_ffffffffffffff20 = (char *)(local_20 + (double)local_80);
                        local_80 = in_stack_ffffffffffffff20;
                        if ((double)local_18 < (double)in_stack_ffffffffffffff20) {
                          in_stack_ffffffffffffff20 = local_18;
                          local_80 = local_18;
                        }
                      }
                      printf("   ---------------------\n");
                      fclose(local_70);
                      local_44 = ARKodeGetNumSteps(local_68,&local_88);
                      check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                 in_stack_ffffffffffffff1c);
                      local_44 = ARKodeGetNumStepAttempts(local_68,&local_90);
                      check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                 in_stack_ffffffffffffff1c);
                      local_44 = ARKStepGetNumRhsEvals(local_68,&local_98,&local_a0);
                      check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                 in_stack_ffffffffffffff1c);
                      local_44 = ARKodeGetNumLinSolvSetups(local_68,&local_a8);
                      check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                 in_stack_ffffffffffffff1c);
                      local_44 = ARKodeGetNumErrTestFails(local_68,&local_d0);
                      check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                 in_stack_ffffffffffffff1c);
                      local_44 = ARKodeGetNumNonlinSolvIters(local_68,&stack0xffffffffffffff40);
                      check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                 in_stack_ffffffffffffff1c);
                      local_44 = ARKodeGetNumNonlinSolvConvFails(local_68,&stack0xffffffffffffff38);
                      check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                 in_stack_ffffffffffffff1c);
                      local_44 = ARKodeGetNumJacEvals(local_68,&stack0xffffffffffffff50);
                      check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                 in_stack_ffffffffffffff1c);
                      local_44 = ARKodeGetNumLinRhsEvals(local_68,&stack0xffffffffffffff48);
                      check_flag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                 in_stack_ffffffffffffff1c);
                      printf("\nFinal Solver Statistics:\n");
                      printf("   Internal solver steps = %li (attempted = %li)\n",local_88,local_90)
                      ;
                      printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_98,local_a0);
                      printf("   Total linear solver setups = %li\n",local_a8);
                      printf("   Total RHS evals for setting up the linear system = %li\n",
                             in_stack_ffffffffffffff48);
                      printf("   Total number of Jacobian evaluations = %li\n",
                             in_stack_ffffffffffffff50);
                      printf("   Total number of Newton iterations = %li\n",
                             in_stack_ffffffffffffff40);
                      printf("   Total number of linear solver convergence failures = %li\n",
                             in_stack_ffffffffffffff38);
                      printf("   Total number of error test failures = %li\n\n",local_d0);
                      local_44 = check_ans(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                                           in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
                      N_VDestroy(local_50);
                      ARKodeFree(&local_68);
                      SUNLinSolFree(local_60);
                      SUNMatDestroy(local_58);
                      SUNContext_Free(&stack0xffffffffffffff28);
                      local_4 = local_44;
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0);   /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);    /* time between outputs */
  sunindextype NEQ   = 1;                  /* number of dependent vars. */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-10);
  sunrealtype lamda  = SUN_RCONST(-100.0); /* stiffness parameter */

  /* general problem variables */
  int flag;                  /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  SUNMatrix A        = NULL; /* empty matrix for linear solver */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKode memory structure */
  FILE* UFID;
  sunrealtype t, tout;
  long int nst, nst_a, nfe, nfi, nsetups, nje, nfeLS, nni, ncfn, netf;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Initial diagnostics output */
  printf("\nAnalytical ODE test problem:\n");
  printf("    lamda = %" GSYM "\n", lamda);
  printf("   reltol = %.1" ESYM "\n", reltol);
  printf("   abstol = %.1" ESYM "\n\n", abstol);

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(SUN_RCONST(0.0), y); /* Specify initial condition */

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetUserData(arkode_mem,
                           (void*)&lamda); /* Pass lamda to user functions */
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  /* Initialize dense matrix data structure and solver */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_flag((void*)A, "SUNDenseMatrix", 0)) { return 1; }
  LS = SUNLinSol_Dense(y, A, ctx);
  if (check_flag((void*)LS, "SUNLinSol_Dense", 0)) { return 1; }

  /* Linear solver interface */
  flag = ARKodeSetLinearSolver(arkode_mem, LS,
                               A); /* Attach matrix and linear solver */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacFn(arkode_mem, Jac); /* Set Jacobian routine */
  if (check_flag(&flag, "ARKodeSetJacFn", 1)) { return 1; }

  /* Specify linearly implicit RHS, with non-time-dependent Jacobian */
  flag = ARKodeSetLinear(arkode_mem, 0);
  if (check_flag(&flag, "ARKodeSetLinear", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM "\n", T0, NV_Ith_S(y, 0));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u\n");
  printf("   ---------------------\n");
  while (Tf - t > 1.0e-15)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(y, 0)); /* access/print solution */
    fprintf(UFID, " %.16" ESYM " %.16" ESYM "\n", t, NV_Ith_S(y, 0));
    if (flag >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ---------------------\n");
  fclose(UFID);

  /* Get/print some final statistics on how the solve progressed */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_flag(&flag, "ARKodeGetNumLinSolvSetups", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);
  flag = ARKodeGetNumJacEvals(arkode_mem, &nje);
  check_flag(&flag, "ARKodeGetNumJacEvals", 1);
  flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_flag(&flag, "ARKodeGetNumLinRhsEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of linear solver convergence failures = %li\n", ncfn);
  printf("   Total number of error test failures = %li\n\n", netf);

  /* check the solution error */
  flag = check_ans(y, t, reltol, abstol);

  /* Clean up and return */
  N_VDestroy(y);           /* Free y vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNMatDestroy(A);        /* Free A matrix */
  SUNContext_Free(&ctx);   /* Free context */

  return flag;
}